

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,StringTree *params_2,FixedArray<char,_1UL> *params_3)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_80;
  StringTree *local_68;
  ArrayPtr<const_char> *local_60;
  char *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_58 = (this->text).content.ptr;
  uStack_50 = 1;
  local_48 = *(undefined8 *)params_1;
  local_40 = 1;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x4;
  local_68 = params_2;
  local_60 = params;
  sVar1 = kj::_::sum((_ *)&local_58,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_58 = (this->text).content.ptr;
  uStack_50 = 1;
  local_48 = 0;
  local_40 = 1;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x4;
  sVar1 = kj::_::sum((_ *)&local_58,nums_00);
  heapString((String *)&local_80,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_80);
  Array<char>::~Array((Array<char> *)&local_80);
  local_58 = (char *)0x0;
  uStack_50 = 0;
  local_48 = 1;
  local_40 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x4;
  sVar1 = kj::_::sum((_ *)&local_58,nums_01);
  local_80.ptr = kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_80.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_80.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_80);
  Array<kj::StringTree::Branch>::~Array(&local_80);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)this,
             (FixedArray<char,_1UL> *)local_60,(StringTree *)params_1,
             (FixedArray<char,_1UL> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}